

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UChar * icu_63::TimeZone::findID(UnicodeString *id)

{
  UBool UVar1;
  int32_t indexS;
  UResourceBundle *resB;
  UResourceBundle *array;
  int32_t idx;
  UResourceBundle *names;
  UResourceBundle *rb;
  UChar *pUStack_18;
  UErrorCode ec;
  UChar *result;
  UnicodeString *id_local;
  
  pUStack_18 = (UChar *)0x0;
  rb._4_4_ = U_ZERO_ERROR;
  result = (UChar *)id;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",(UErrorCode *)((long)&rb + 4));
  array = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,(UErrorCode *)((long)&rb + 4));
  indexS = findInStringArray(array,(UnicodeString *)result,(UErrorCode *)((long)&rb + 4));
  pUStack_18 = ures_getStringByIndex_63(array,indexS,(int32_t *)0x0,(UErrorCode *)((long)&rb + 4));
  UVar1 = ::U_FAILURE(rb._4_4_);
  if (UVar1 != '\0') {
    pUStack_18 = (UChar *)0x0;
  }
  ures_close_63(array);
  ures_close_63(resB);
  return pUStack_18;
}

Assistant:

const UChar*
TimeZone::findID(const UnicodeString& id) {
    const UChar *result = NULL;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle *rb = ures_openDirect(NULL, kZONEINFO, &ec);

    // resolve zone index by name
    UResourceBundle *names = ures_getByKey(rb, kNAMES, NULL, &ec);
    int32_t idx = findInStringArray(names, id, ec);
    result = ures_getStringByIndex(names, idx, NULL, &ec);
    if (U_FAILURE(ec)) {
        result = NULL;
    }
    ures_close(names);
    ures_close(rb);
    return result;
}